

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::PerspectiveCameraData::PerspectiveCameraData
          (PerspectiveCameraData *this,PerspectiveCameraData *other,AffineSpace3fa *space)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined8 local_658;
  undefined8 uStack_650;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  AffineSpace3fa *space_local;
  PerspectiveCameraData *other_local;
  PerspectiveCameraData *this_local;
  
  fVar1 = (other->from).field_0.m128[0];
  uVar2 = *(undefined8 *)&(space->l).vx.field_0;
  uVar3 = *(undefined8 *)((long)&(space->l).vx.field_0 + 8);
  local_508 = (float)uVar2;
  fStack_504 = (float)((ulong)uVar2 >> 0x20);
  fStack_500 = (float)uVar3;
  fStack_4fc = (float)((ulong)uVar3 >> 0x20);
  local_558 = (float)local_658;
  fStack_554 = (float)((ulong)local_658 >> 0x20);
  fStack_550 = (float)uStack_650;
  fStack_54c = (float)((ulong)uStack_650 >> 0x20);
  *(ulong *)&(this->from).field_0 =
       CONCAT44(fVar1 * fStack_504 + fStack_554,fVar1 * local_508 + local_558);
  *(ulong *)((long)&(this->from).field_0 + 8) =
       CONCAT44(fVar1 * fStack_4fc + fStack_54c,fVar1 * fStack_500 + fStack_550);
  fVar1 = (other->to).field_0.m128[0];
  uVar2 = *(undefined8 *)&(space->l).vx.field_0;
  uVar3 = *(undefined8 *)((long)&(space->l).vx.field_0 + 8);
  local_888 = (float)uVar2;
  fStack_884 = (float)((ulong)uVar2 >> 0x20);
  fStack_880 = (float)uVar3;
  fStack_87c = (float)((ulong)uVar3 >> 0x20);
  local_8d8 = (float)local_9d8;
  fStack_8d4 = (float)((ulong)local_9d8 >> 0x20);
  fStack_8d0 = (float)uStack_9d0;
  fStack_8cc = (float)((ulong)uStack_9d0 >> 0x20);
  *(ulong *)&(this->to).field_0 =
       CONCAT44(fVar1 * fStack_884 + fStack_8d4,fVar1 * local_888 + local_8d8);
  *(ulong *)((long)&(this->to).field_0 + 8) =
       CONCAT44(fVar1 * fStack_87c + fStack_8cc,fVar1 * fStack_880 + fStack_8d0);
  fVar1 = (other->up).field_0.m128[0];
  uVar2 = *(undefined8 *)&(space->l).vx.field_0;
  uVar3 = *(undefined8 *)((long)&(space->l).vx.field_0 + 8);
  local_128 = (float)uVar2;
  fStack_124 = (float)((ulong)uVar2 >> 0x20);
  fStack_120 = (float)uVar3;
  fStack_11c = (float)((ulong)uVar3 >> 0x20);
  local_178 = (float)local_2c8;
  fStack_174 = (float)((ulong)local_2c8 >> 0x20);
  fStack_170 = (float)uStack_2c0;
  fStack_16c = (float)((ulong)uStack_2c0 >> 0x20);
  *(ulong *)&(this->up).field_0 =
       CONCAT44(fVar1 * fStack_124 + fStack_174,fVar1 * local_128 + local_178);
  *(ulong *)((long)&(this->up).field_0 + 8) =
       CONCAT44(fVar1 * fStack_11c + fStack_16c,fVar1 * fStack_120 + fStack_170);
  this->fov = other->fov;
  return;
}

Assistant:

PerspectiveCameraData (const PerspectiveCameraData& other, const AffineSpace3fa& space)
        : from(xfmPoint(space,other.from)), to(xfmPoint(space,other.to)), up(xfmVector(space,other.up)), fov(other.fov) {}